

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

bool duckdb_yyjson::read_number_raw
               (u8 **ptr,u8 **pre,yyjson_read_flag flg,yyjson_val *val,char **msg)

{
  u8 uVar1;
  byte bVar2;
  u8 *puVar3;
  bool bVar4;
  char *pcVar5;
  uint64_t uVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  
  puVar3 = *ptr;
  if (*pre != (u8 *)0x0) {
    **pre = '\0';
  }
  uVar1 = *puVar3;
  bVar9 = uVar1 == '-';
  pbVar8 = puVar3 + bVar9;
  bVar2 = puVar3[bVar9];
  if ((digi_table[bVar2] & 3) == 0) {
    if ((flg & 0x10) == 0) {
LAB_0126b9e5:
      pcVar5 = "no digit after minus sign";
LAB_0126b9d1:
      *msg = pcVar5;
      bVar9 = false;
      goto LAB_0126b9d6;
    }
    if ((((bVar2 | 0x20) == 0x69) && ((pbVar8[1] | 0x20) == 0x6e)) && ((pbVar8[2] | 0x20) == 0x66))
    {
      pbVar7 = pbVar8 + 3;
      if ((((pbVar8[3] | 0x20) == 0x69) && ((pbVar8[4] | 0x20) == 0x6e)) &&
         (((pbVar8[5] | 0x20) == 0x69 &&
          (((pbVar8[6] | 0x20) == 0x74 && ((pbVar8[7] | 0x20) == 0x79)))))) {
        pbVar7 = pbVar8 + 8;
      }
      uVar6 = (long)pbVar8 - (ulong)(uVar1 == '-');
      if (*pre != (u8 *)0x0) {
        **pre = '\0';
      }
      *pre = pbVar7;
      val->tag = ((long)pbVar7 - uVar6) * 0x100 + 1;
      (val->uni).u64 = uVar6;
      bVar9 = true;
      pbVar8 = pbVar7;
    }
    else {
      bVar9 = false;
    }
    bVar4 = true;
    if (!bVar9) {
      if ((((*pbVar8 | 0x20) == 0x6e) && ((pbVar8[1] | 0x20) == 0x61)) &&
         ((pbVar8[2] | 0x20) == 0x6e)) {
        pbVar7 = pbVar8 + -(ulong)(uVar1 == '-');
        pbVar8 = pbVar8 + 3;
        if (*pre != (u8 *)0x0) {
          **pre = '\0';
        }
        *pre = pbVar8;
        val->tag = (ulong)(uVar1 == '-') * 0x100 + 0x301;
        (val->uni).str = (char *)pbVar7;
      }
      else {
        bVar4 = false;
      }
    }
    if (!bVar4) goto LAB_0126b9e5;
LAB_0126b97b:
    val->tag = ((long)pbVar8 - (long)puVar3) * 0x100 + 1;
  }
  else {
    if (bVar2 == 0x30) {
      pbVar7 = pbVar8 + 1;
      if ((digi_table[*pbVar7] & 3) != 0) {
        *msg = "number with leading zero is not allowed";
        bVar9 = false;
        goto LAB_0126b9d6;
      }
      pbVar8 = pbVar8 + 1;
      if ((digi_table[*pbVar7] & 0x30) == 0) {
        val->tag = ((long)pbVar8 - (long)puVar3) * 0x100 + 1;
        (val->uni).str = (char *)puVar3;
        *pre = pbVar8;
        bVar9 = true;
        goto LAB_0126b9d6;
      }
LAB_0126b915:
      if (*pbVar8 == 0x2e) {
        if ((digi_table[pbVar8[1]] & 3) == 0) {
          pbVar8 = pbVar8 + 2;
          pcVar5 = "no digit after decimal point";
          goto LAB_0126b9d1;
        }
        pbVar8 = pbVar8 + 1;
        do {
          pbVar7 = pbVar8 + 1;
          pbVar8 = pbVar8 + 1;
        } while ((digi_table[*pbVar7] & 3) != 0);
      }
      if ((digi_table[*pbVar8] & 0x20) != 0) {
        bVar9 = (digi_table[pbVar8[1]] & 0xc) == 0;
        if ((digi_table[pbVar8[2 - (ulong)bVar9]] & 3) == 0) {
          pbVar8 = pbVar8 + (3 - (ulong)bVar9);
          pcVar5 = "no digit after exponent sign";
          goto LAB_0126b9d1;
        }
        pbVar8 = pbVar8 + (2 - (ulong)bVar9);
        do {
          pbVar7 = pbVar8 + 1;
          pbVar8 = pbVar8 + 1;
        } while ((digi_table[*pbVar7] & 3) != 0);
      }
      goto LAB_0126b97b;
    }
    pbVar8 = puVar3 + ((ulong)bVar9 - 1);
    uVar6 = (ulong)bVar9 * 0x100 - 0xff;
    do {
      pbVar7 = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
      uVar6 = uVar6 + 0x100;
    } while ((digi_table[*pbVar7] & 3) != 0);
    if ((digi_table[*pbVar7] & 0x30) != 0) goto LAB_0126b915;
    val->tag = uVar6;
  }
  (val->uni).str = (char *)puVar3;
  *pre = pbVar8;
  bVar9 = true;
LAB_0126b9d6:
  *ptr = pbVar8;
  return bVar9;
}

Assistant:

static_noinline bool read_number_raw(u8 **ptr,
                                     u8 **pre,
                                     yyjson_read_flag flg,
                                     yyjson_val *val,
                                     const char **msg) {

#define return_err(_pos, _msg) do { \
    *msg = _msg; \
    *end = _pos; \
    return false; \
} while (false)

#define return_raw() do { \
    val->tag = ((u64)(cur - hdr) << YYJSON_TAG_BIT) | YYJSON_TYPE_RAW; \
    val->uni.str = (const char *)hdr; \
    *pre = cur; *end = cur; return true; \
} while (false)

    u8 *hdr = *ptr;
    u8 *cur = *ptr;
    u8 **end = ptr;

    /* add null-terminator for previous raw string */
    if (*pre) **pre = '\0';

    /* skip sign */
    cur += (*cur == '-');

    /* read first digit, check leading zero */
    if (unlikely(!digi_is_digit(*cur))) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (read_inf_or_nan(*hdr == '-', &cur, pre, val)) return_raw();
        }
        return_err(cur, "no digit after minus sign");
    }

    /* read integral part */
    if (*cur == '0') {
        cur++;
        if (unlikely(digi_is_digit(*cur))) {
            return_err(cur - 1, "number with leading zero is not allowed");
        }
        if (!digi_is_fp(*cur)) return_raw();
    } else {
        while (digi_is_digit(*cur)) cur++;
        if (!digi_is_fp(*cur)) return_raw();
    }

    /* read fraction part */
    if (*cur == '.') {
        cur++;
        if (!digi_is_digit(*cur++)) {
            return_err(cur, "no digit after decimal point");
        }
        while (digi_is_digit(*cur)) cur++;
    }

    /* read exponent part */
    if (digi_is_exp(*cur)) {
        cur += 1 + digi_is_sign(cur[1]);
        if (!digi_is_digit(*cur++)) {
            return_err(cur, "no digit after exponent sign");
        }
        while (digi_is_digit(*cur)) cur++;
    }

    return_raw();

#undef return_err
#undef return_raw
}